

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O1

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
          (CCommandBuffer *this,CRenderCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  undefined4 uVar3;
  long lVar4;
  CCommand *pCVar5;
  ulong uVar6;
  CCommand *pCVar7;
  ulong uVar8;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar6 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar8 = (uVar1 - uVar6) + 0x68;
  if ((this->m_CmdBuffer).m_Size < uVar8) {
    pCVar5 = (CCommand *)0x0;
  }
  else {
    pCVar5 = (CCommand *)(puVar2 + (uVar1 - uVar6) + 8);
    (this->m_CmdBuffer).m_Used = (uint)uVar8;
  }
  if (pCVar5 != (CCommand *)0x0) {
    pCVar7 = pCVar5;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar3 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
      pCVar7->m_Cmd = (Command->super_CCommand).m_Cmd;
      *(undefined4 *)&pCVar7->field_0x4 = uVar3;
      Command = (CRenderCommand *)&(Command->super_CCommand).m_pNext;
      pCVar7 = (CCommand *)&pCVar7->m_pNext;
    }
    pCVar5->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar5;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar5;
    }
    this->m_pCmdBufferTail = pCVar5;
  }
  return pCVar5 != (CCommand *)0x0;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}